

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

shared_ptr<wasm::ExnData> __thiscall wasm::Literal::getExnData(Literal *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<wasm::ExnData> sVar2;
  
  bVar1 = wasm::Type::isExn((Type *)(in_RSI + 1));
  if (!bVar1) {
    __assert_fail("isExn()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x14e,"std::shared_ptr<ExnData> wasm::Literal::getExnData() const");
  }
  if (in_RSI->_M_ptr != (element_type *)0x0) {
    std::__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *)this,in_RSI);
    sVar2.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wasm::ExnData>)
           sVar2.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("exnData",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x14f,"std::shared_ptr<ExnData> wasm::Literal::getExnData() const");
}

Assistant:

std::shared_ptr<ExnData> Literal::getExnData() const {
  assert(isExn());
  assert(exnData);
  return exnData;
}